

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O3

void Sim_SymmsAppendFromGroup
               (Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodesPi,Vec_Ptr_t *vNodesOther,Vec_Int_t *vSymms,
               int *pMap)

{
  uint uVar1;
  uint uVar2;
  uint uSymm;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  iVar9 = vNodesPi->nSize;
  if (0 < iVar9) {
    lVar7 = 1;
    lVar5 = 0;
    do {
      lVar6 = lVar5 + 1;
      lVar4 = (long)iVar9;
      lVar8 = lVar7;
      if (lVar6 < lVar4) {
        do {
          uVar1 = pMap[*(int *)(((ulong)vNodesPi->pArray[lVar5] & 0xfffffffffffffffe) + 0x10)];
          uVar2 = pMap[*(int *)(((ulong)vNodesPi->pArray[lVar8] & 0xfffffffffffffffe) + 0x10)];
          if (uVar1 == uVar2) {
            __assert_fail("pMap[pNode1->Id] != pMap[pNode2->Id]",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSymStr.c"
                          ,0xf0,
                          "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                         );
          }
          if ((int)uVar1 < 0) {
            __assert_fail("pMap[pNode1->Id] >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSymStr.c"
                          ,0xf1,
                          "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                         );
          }
          if ((int)uVar2 < 0) {
            __assert_fail("pMap[pNode2->Id] >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sim/simSymStr.c"
                          ,0xf2,
                          "void Sim_SymmsAppendFromGroup(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *, int *)"
                         );
          }
          uSymm = uVar2 << 0x10 | uVar1;
          if (uVar1 < uVar2) {
            uSymm = uVar1 << 0x10 | uVar2;
          }
          iVar3 = Sim_SymmsIsCompatibleWithNodes(pNtk,uSymm,vNodesOther,(int *)(ulong)uVar2);
          if (iVar3 != 0) {
            Vec_IntPushUnique(vSymms,uSymm);
            iVar9 = vNodesPi->nSize;
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < iVar9);
        lVar4 = (long)iVar9;
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar6;
    } while (lVar6 < lVar4);
  }
  return;
}

Assistant:

void Sim_SymmsAppendFromGroup( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodesPi, Vec_Ptr_t * vNodesOther, Vec_Int_t * vSymms, int * pMap )
{
    Abc_Obj_t * pNode1, * pNode2;
    unsigned uSymm;
    int i, k;

    if ( vNodesPi->nSize == 0 )
        return;

    // go through the pairs
    for ( i = 0; i < vNodesPi->nSize; i++ )
    for ( k = i+1; k < vNodesPi->nSize; k++ )
    {
        // get the two PI nodes
        pNode1 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[i]);
        pNode2 = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[k]);
        assert( pMap[pNode1->Id] != pMap[pNode2->Id] );
        assert( pMap[pNode1->Id] >= 0 );
        assert( pMap[pNode2->Id] >= 0 );
        // generate symmetry
        if ( pMap[pNode1->Id] < pMap[pNode2->Id] )
            uSymm = ((pMap[pNode1->Id] << 16) | pMap[pNode2->Id]);
        else
            uSymm = ((pMap[pNode2->Id] << 16) | pMap[pNode1->Id]);
        // check if symmetry belongs
        if ( Sim_SymmsIsCompatibleWithNodes( pNtk, uSymm, vNodesOther, pMap ) )
            Vec_IntPushUnique( vSymms, (int)uSymm );
    }
}